

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lp_solver.cc
# Opt level: O3

void __thiscall ipx::LpSolver::ComputeStartingPoint(LpSolver *this,IPM *ipm)

{
  double dVar1;
  Timer timer;
  KKTSolverDiag kkt;
  Timer local_d0;
  KKTSolverDiag local_c8;
  
  Timer::Timer(&local_d0);
  KKTSolverDiag::KKTSolverDiag(&local_c8,&this->control_,&this->model_);
  IPM::StartingPoint(ipm,&local_c8.super_KKTSolver,
                     (this->iterate_)._M_t.
                     super___uniq_ptr_impl<ipx::Iterate,_std::default_delete<ipx::Iterate>_>._M_t.
                     super__Tuple_impl<0UL,_ipx::Iterate_*,_std::default_delete<ipx::Iterate>_>.
                     super__Head_base<0UL,_ipx::Iterate_*,_false>._M_head_impl,&this->info_);
  dVar1 = Timer::Elapsed(&local_d0);
  (this->info_).super_ipx_info.time_ipm1 = dVar1 + (this->info_).super_ipx_info.time_ipm1;
  local_c8.super_KKTSolver._vptr_KKTSolver = (_func_int **)&PTR__KKTSolverDiag_00441988;
  operator_delete(local_c8.resscale_._M_data);
  operator_delete(local_c8.W_._M_data);
  local_c8.precond_.super_LinearOperator._vptr_LinearOperator =
       (_func_int **)&PTR__DiagonalPrecond_00441830;
  operator_delete(local_c8.precond_.diagonal_._M_data);
  local_c8.normal_matrix_.super_LinearOperator._vptr_LinearOperator =
       (_func_int **)&PTR__NormalMatrix_004419e8;
  operator_delete(local_c8.normal_matrix_.work_._M_data);
  return;
}

Assistant:

void LpSolver::ComputeStartingPoint(IPM& ipm) {
    Timer timer;
    KKTSolverDiag kkt(control_, model_);

    // If the starting point procedure fails, then iterate_ remains as
    // initialized by the constructor, which is a valid state for
    // postprocessing/postsolving.
    ipm.StartingPoint(&kkt, iterate_.get(), &info_);
    info_.time_ipm1 += timer.Elapsed();
}